

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemXP::Unpause(SoundSystemXP *this,uint64_t sndId)

{
  bool bVar1;
  SoundChannel *this_00;
  SoundChannel *pChn;
  FmodError *this_01;
  uint64_t in_stack_fffffffffffffef0;
  SoundSystem *in_stack_fffffffffffffef8;
  allocator<char> local_f9;
  string local_f8 [8];
  FmodError *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_d1;
  string local_d0 [24];
  string *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  FMOD_RESULT in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  FmodError *in_stack_ffffffffffffff70;
  
  this_00 = SoundSystem::GetChn(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if ((((this_00 != (SoundChannel *)0x0) && (this_00->pChn != (FMOD_CHANNEL *)0x0)) &&
      (bVar1 = SoundChannel::ShallUnpause(this_00), bVar1)) &&
     (gFmodRes = FMOD_Channel_SetPaused(this_00->pChn,0), gFmodRes != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (allocator<char> *)in_stack_ffffffffffffff10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (allocator<char> *)in_stack_ffffffffffffff10);
    this_01 = (FmodError *)&local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (allocator<char> *)in_stack_ffffffffffffff10);
    FmodError::FmodError
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               (string *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               in_stack_ffffffffffffff48);
    FmodError::LogErr(in_stack_ffffffffffffff10);
    FmodError::~FmodError(this_01);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  }
  return;
}

Assistant:

void SoundSystemXP::Unpause ([[maybe_unused]] uint64_t sndId)
{
#if INCLUDE_FMOD_SOUND + 0 >= 1
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn) return;

    if (pChn->ShallUnpause()) {
        FMOD_LOG(FMOD_Channel_SetPaused(pChn->pChn, false));
    }
#endif
}